

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.cpp
# Opt level: O0

void __thiscall spvtools::opt::SSARewriter::PrintReplacementTable(SSARewriter *this)

{
  bool bVar1;
  reference pvVar2;
  ostream *poVar3;
  value_type *it;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *__range2;
  SSARewriter *this_local;
  
  std::operator<<((ostream *)&std::cerr,"\nLoad replacement table\n");
  __end2 = std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::begin(&this->load_replacement_);
  it = (value_type *)
       std::
       unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
       ::end(&this->load_replacement_);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> *)
                        &it);
    if (!bVar1) break;
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
             operator*(&__end2);
    poVar3 = std::operator<<((ostream *)&std::cerr,"\t%");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar2->first);
    poVar3 = std::operator<<(poVar3," -> %");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar2->second);
    std::operator<<(poVar3,"\n");
    std::__detail::_Node_const_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
    operator++(&__end2);
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  return;
}

Assistant:

void SSARewriter::PrintReplacementTable() const {
  std::cerr << "\nLoad replacement table\n";
  for (const auto& it : load_replacement_) {
    std::cerr << "\t%" << it.first << " -> %" << it.second << "\n";
  }
  std::cerr << "\n";
}